

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O1

void vkt::SpirVAssembly::createPipelineShaderStages
               (DeviceInterface *vk,VkDevice vkDevice,InstanceContext *instance,Context *context,
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
               *modules,vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                        *createInfos)

{
  int *piVar1;
  DeviceInterface *pDVar2;
  pointer *ppVVar3;
  iterator __position;
  _func_int **pp_Var4;
  const_iterator cVar5;
  DeviceInterface *pDVar6;
  _Base_ptr p_Var7;
  EntryToStage *stage;
  _Base_ptr p_Var8;
  ModuleHandleSp mod;
  VkPipelineShaderStageCreateInfo shaderParam;
  VkShaderModule local_88;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_80;
  char *local_68;
  VkSpecializationInfo *pVStack_60;
  _Rb_tree_node_base *local_50;
  DeviceInterface *local_48;
  VkDevice local_40;
  Context *local_38;
  
  p_Var7 = (instance->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50 = &(instance->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_50) {
    local_48 = vk;
    local_40 = vkDevice;
    local_38 = context;
    do {
      pp_Var4 = (_func_int **)operator_new(0x20);
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                      *)local_38->m_progCollection,(key_type *)(p_Var7 + 1));
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_88,local_48,local_40,
                 *(ProgramBinary **)(cVar5._M_node + 2),0);
      pp_Var4[2] = (_func_int *)DStack_80.m_device;
      pp_Var4[3] = (_func_int *)DStack_80.m_allocator;
      *pp_Var4 = (_func_int *)local_88.m_internal;
      pp_Var4[1] = (_func_int *)DStack_80.m_deviceIface;
      local_88.m_internal = 0;
      DStack_80.m_deviceIface = (DeviceInterface *)0x0;
      DStack_80.m_device = (VkDevice)0x0;
      DStack_80.m_allocator = (VkAllocationCallbacks *)0x0;
      pDVar6 = (DeviceInterface *)operator_new(0x20);
      *(undefined4 *)&pDVar6[1]._vptr_DeviceInterface = 0;
      *(undefined4 *)((long)&pDVar6[1]._vptr_DeviceInterface + 4) = 0;
      pDVar6->_vptr_DeviceInterface = (_func_int **)&PTR__SharedPtrState_00d1dfd0;
      pDVar6[2]._vptr_DeviceInterface = pp_Var4;
      *(undefined4 *)&pDVar6[1]._vptr_DeviceInterface = 1;
      *(undefined4 *)((long)&pDVar6[1]._vptr_DeviceInterface + 4) = 1;
      if (local_88.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_80,local_88);
      }
      if (pDVar6 != (DeviceInterface *)0x0) {
        LOCK();
        *(int *)&pDVar6[1]._vptr_DeviceInterface = *(int *)&pDVar6[1]._vptr_DeviceInterface + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)((long)&pDVar6[1]._vptr_DeviceInterface + 4);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_88.m_internal = (deUint64)pp_Var4;
      DStack_80.m_deviceIface = pDVar6;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
                  *)modules,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&local_88);
      if (DStack_80.m_deviceIface != (DeviceInterface *)0x0) {
        LOCK();
        pDVar2 = DStack_80.m_deviceIface + 1;
        *(int *)&pDVar2->_vptr_DeviceInterface = *(int *)&pDVar2->_vptr_DeviceInterface + -1;
        UNLOCK();
        if (*(int *)&pDVar2->_vptr_DeviceInterface == 0) {
          local_88.m_internal = 0;
          (*(DStack_80.m_deviceIface)->_vptr_DeviceInterface[2])();
        }
        LOCK();
        piVar1 = (int *)((long)&DStack_80.m_deviceIface[1]._vptr_DeviceInterface + 4);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (DStack_80.m_deviceIface != (DeviceInterface *)0x0) {
            (*(DStack_80.m_deviceIface)->_vptr_DeviceInterface[1])();
          }
          DStack_80.m_deviceIface = (DeviceInterface *)0x0;
        }
      }
      for (p_Var8 = *(_Base_ptr *)(p_Var7 + 2); p_Var8 != p_Var7[2]._M_parent;
          p_Var8 = (_Base_ptr)&p_Var8[1]._M_parent) {
        local_88.m_internal._0_4_ = 0x12;
        DStack_80.m_deviceIface = (DeviceInterface *)0x0;
        DStack_80.m_device = (VkDevice)((ulong)p_Var8[1]._M_color << 0x20);
        DStack_80.m_allocator =
             (VkAllocationCallbacks *)
             (((modules->
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
        local_68 = *(char **)p_Var8;
        pVStack_60 = (VkSpecializationInfo *)0x0;
        __position._M_current =
             (createInfos->
             super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (createInfos->
            super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
          ::_M_realloc_insert<vk::VkPipelineShaderStageCreateInfo_const&>
                    ((vector<vk::VkPipelineShaderStageCreateInfo,std::allocator<vk::VkPipelineShaderStageCreateInfo>>
                      *)createInfos,__position,(VkPipelineShaderStageCreateInfo *)&local_88);
        }
        else {
          (__position._M_current)->pName = local_68;
          (__position._M_current)->pSpecializationInfo = (VkSpecializationInfo *)0x0;
          *(VkDevice *)&(__position._M_current)->flags = DStack_80.m_device;
          ((__position._M_current)->module).m_internal = (deUint64)DStack_80.m_allocator;
          *(deUint64 *)__position._M_current = local_88.m_internal;
          (__position._M_current)->pNext = (void *)0x0;
          ppVVar3 = &(createInfos->
                     super__Vector_base<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppVVar3 = *ppVVar3 + 1;
        }
      }
      if (pDVar6 != (DeviceInterface *)0x0) {
        LOCK();
        pDVar2 = pDVar6 + 1;
        *(int *)&pDVar2->_vptr_DeviceInterface = *(int *)&pDVar2->_vptr_DeviceInterface + -1;
        UNLOCK();
        if (*(int *)&pDVar2->_vptr_DeviceInterface == 0) {
          (*pDVar6->_vptr_DeviceInterface[2])();
        }
        LOCK();
        piVar1 = (int *)((long)&pDVar6[1]._vptr_DeviceInterface + 4);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) && (pDVar6 != (DeviceInterface *)0x0)) {
          (*pDVar6->_vptr_DeviceInterface[1])();
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_50);
  }
  return;
}

Assistant:

void createPipelineShaderStages (const DeviceInterface&						vk,
								 const VkDevice								vkDevice,
								 InstanceContext&							instance,
								 Context&									context,
								 vector<ModuleHandleSp>&					modules,
								 vector<VkPipelineShaderStageCreateInfo>&	createInfos)
{
	for (ModuleMap::const_iterator moduleNdx = instance.moduleMap.begin(); moduleNdx != instance.moduleMap.end(); ++moduleNdx)
	{
		const ModuleHandleSp mod(new Unique<VkShaderModule>(createShaderModule(vk, vkDevice, context.getBinaryCollection().get(moduleNdx->first), 0)));
		modules.push_back(ModuleHandleSp(mod));
		for (vector<EntryToStage>::const_iterator shaderNdx = moduleNdx->second.begin(); shaderNdx != moduleNdx->second.end(); ++shaderNdx)
		{
			const EntryToStage&						stage			= *shaderNdx;
			const VkPipelineShaderStageCreateInfo	shaderParam		=
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	//	VkStructureType			sType;
				DE_NULL,												//	const void*				pNext;
				(VkPipelineShaderStageCreateFlags)0,
				stage.second,											//	VkShaderStageFlagBits	stage;
				**modules.back(),										//	VkShaderModule			module;
				stage.first.c_str(),									//	const char*				pName;
				(const VkSpecializationInfo*)DE_NULL,
			};
			createInfos.push_back(shaderParam);
		}
	}
}